

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::OptimizeLinkDependencies
          (cmComputeTargetDepends *this,cmGeneratorTarget *gt,cmGraphEdgeList *outputEdges,
          cmGraphEdgeList *inputEdges)

{
  mapped_type_conflict1 mVar1;
  size_t this_00;
  bool bVar2;
  int iVar3;
  reference this_01;
  reference this_02;
  pointer ppVar4;
  reference ppcVar5;
  mapped_type_conflict1 *pmVar6;
  size_type sVar7;
  cmListFileBacktrace *pcVar8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar9;
  cmListFileBacktrace local_1b0;
  cmGraphEdge local_1a0;
  _Base_ptr local_188;
  undefined1 local_180;
  mapped_type_conflict1 local_174;
  cmGeneratorTarget *pcStack_170;
  mapped_type_conflict1 index_1;
  cmGeneratorTarget *dep_1;
  iterator __end5;
  iterator __begin5;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range5;
  _Self local_148;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lang;
  iterator __end3_1;
  iterator __begin3_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  cmGraphEdge local_e0;
  _Base_ptr local_c8;
  undefined1 local_c0;
  mapped_type_conflict1 local_b4;
  cmGeneratorTarget *pcStack_b0;
  mapped_type_conflict1 index;
  cmGeneratorTarget *dep;
  iterator __end3;
  iterator __begin3;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *__range3;
  value_type *dse;
  cmGraphEdge *edge;
  const_iterator __end1;
  const_iterator __begin1;
  cmGraphEdgeList *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  cmGraphEdgeList *inputEdges_local;
  cmGraphEdgeList *outputEdges_local;
  cmGeneratorTarget *gt_local;
  cmComputeTargetDepends *this_local;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)inputEdges;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  this_00 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin
                     ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)
                      emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  edge = (cmGraphEdge *)
         std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end
                   ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                     *)&edge), bVar2) {
    this_01 = __gnu_cxx::
              __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
              ::operator*(&__end1);
    bVar2 = cmGraphEdge::IsStrong(this_01);
    if (bVar2) {
      std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back
                (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,this_01);
    }
    else {
      iVar3 = cmGraphEdge::operator_cast_to_int(this_01);
      this_02 = std::
                vector<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                ::operator[](&this->SideEffects,(long)iVar3);
      __end3 = std::
               set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
               ::begin(&this_02->CustomCommandSideEffects);
      dep = (cmGeneratorTarget *)
            std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::end(&this_02->CustomCommandSideEffects);
      while (bVar2 = std::operator!=(&__end3,(_Self *)&dep), bVar2) {
        ppcVar5 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end3);
        pcStack_b0 = *ppcVar5;
        pmVar6 = std::
                 map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                 ::operator[](&this->TargetIndex,&stack0xffffffffffffff50);
        local_b4 = *pmVar6;
        sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_b4);
        if (sVar7 == 0) {
          pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_b4);
          mVar1 = local_b4;
          local_c8 = (_Base_ptr)pVar9.first._M_node;
          local_c0 = pVar9.second;
          bVar2 = cmGraphEdge::IsCross(this_01);
          pcVar8 = cmGraphEdge::GetBacktrace(this_01);
          cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__range3_1,pcVar8);
          cmGraphEdge::cmGraphEdge(&local_e0,mVar1,false,bVar2,(cmListFileBacktrace *)&__range3_1);
          std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back
                    (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,&local_e0
                    );
          cmGraphEdge::~cmGraphEdge(&local_e0);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range3_1);
        }
        std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end3);
      }
      cmGeneratorTarget::GetAllConfigCompileLanguages_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__begin3_1,gt);
      __end3_1 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__begin3_1);
      lang = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin3_1);
      while (bVar2 = std::operator!=(&__end3_1,(_Self *)&lang), bVar2) {
        it._M_node = (_Base_ptr)
                     std::
                     _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end3_1);
        local_148._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
             ::find(&this_02->LanguageSideEffects,(key_type *)it._M_node);
        __range5 = (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    *)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                      ::end(&this_02->LanguageSideEffects);
        bVar2 = std::operator!=(&local_148,(_Self *)&__range5);
        if (bVar2) {
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>
                   ::operator->(&local_148);
          __end5 = std::
                   set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                   ::begin(&ppVar4->second);
          dep_1 = (cmGeneratorTarget *)
                  std::
                  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::end(&ppVar4->second);
          while (bVar2 = std::operator!=(&__end5,(_Self *)&dep_1), bVar2) {
            ppcVar5 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&__end5);
            pcStack_170 = *ppcVar5;
            pmVar6 = std::
                     map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                     ::operator[](&this->TargetIndex,&stack0xfffffffffffffe90);
            local_174 = *pmVar6;
            sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,
                               &local_174);
            if (sVar7 == 0) {
              pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                                ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,
                                 &local_174);
              mVar1 = local_174;
              local_188 = (_Base_ptr)pVar9.first._M_node;
              local_180 = pVar9.second;
              bVar2 = cmGraphEdge::IsCross(this_01);
              pcVar8 = cmGraphEdge::GetBacktrace(this_01);
              cmListFileBacktrace::cmListFileBacktrace(&local_1b0,pcVar8);
              cmGraphEdge::cmGraphEdge(&local_1a0,mVar1,false,bVar2,&local_1b0);
              std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::push_back
                        (&outputEdges->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>,
                         &local_1a0);
              cmGraphEdge::~cmGraphEdge(&local_1a0);
              cmListFileBacktrace::~cmListFileBacktrace(&local_1b0);
            }
            std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&__end5);
          }
        }
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3_1);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin3_1);
    }
    __gnu_cxx::
    __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
    ::operator++(&__end1);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  return;
}

Assistant:

void cmComputeTargetDepends::OptimizeLinkDependencies(
  cmGeneratorTarget const* gt, cmGraphEdgeList& outputEdges,
  cmGraphEdgeList const& inputEdges)
{
  std::set<int> emitted;
  for (auto const& edge : inputEdges) {
    if (edge.IsStrong()) {
      // Preserve strong edges
      outputEdges.push_back(edge);
    } else {
      auto const& dse = this->SideEffects[edge];

      // Add edges that have custom command side effects
      for (cmGeneratorTarget const* dep : dse.CustomCommandSideEffects) {
        auto index = this->TargetIndex[dep];
        if (!emitted.count(index)) {
          emitted.insert(index);
          outputEdges.push_back(
            cmGraphEdge(index, false, edge.IsCross(), edge.GetBacktrace()));
        }
      }

      // Add edges that have language side effects for languages we
      // care about
      for (auto const& lang : gt->GetAllConfigCompileLanguages()) {
        auto it = dse.LanguageSideEffects.find(lang);
        if (it != dse.LanguageSideEffects.end()) {
          for (cmGeneratorTarget const* dep : it->second) {
            auto index = this->TargetIndex[dep];
            if (!emitted.count(index)) {
              emitted.insert(index);
              outputEdges.push_back(cmGraphEdge(index, false, edge.IsCross(),
                                                edge.GetBacktrace()));
            }
          }
        }
      }
    }
  }
}